

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O1

void __thiscall
Diligent::DearchiverBase::UnpackPipelineStateImpl<Diligent::TilePipelineStateCreateInfo>
          (DearchiverBase *this,PipelineStateUnpackInfo *UnpackInfo,IPipelineState **ppPSO)

{
  IPipelineResourceSignature *pIVar1;
  IPipelineResourceSignature *pIVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ArchiveData *Archive;
  IMemoryAllocator *Allocator;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char (*in_RCX) [30];
  ulong uVar6;
  long lVar7;
  ShaderResourceVariableDesc *Var;
  ShaderResourceVariableDesc *pSVar8;
  Char **ppCVar9;
  ImmutableSamplerDesc *pIVar10;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar11;
  string _msg;
  vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  pSignatures;
  vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ImmutableSamplers;
  vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  Variables;
  PipelineResourceLayoutDesc ResourceLayout;
  PSOData<Diligent::TilePipelineStateCreateInfo> PSO;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Strings;
  string local_228;
  PipelineResourceSignatureDesc *local_208;
  void *local_200;
  long local_1f8;
  long local_1f0;
  ImmutableSamplerDesc *local_1e8;
  ImmutableSamplerDesc *local_1e0;
  long local_1d8;
  ShaderResourceVariableDesc *local_1d0;
  ShaderResourceVariableDesc *local_1c8;
  long local_1c0;
  PipelineResourceLayoutDesc local_1b8;
  undefined1 local_190 [40];
  PipelineStateCreateInfo local_168;
  undefined1 local_e8;
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  local_98;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  local_80;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  if (UnpackInfo->pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[30]>
              ((string *)local_190,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"UnpackInfo.pDevice != nullptr",in_RCX);
    DebugAssertionFailed
              ((Char *)local_190._0_8_,"UnpackPipelineStateImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x254);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
  }
  if ((UnpackInfo->ModifyPipelineStateCreateInfo ==
       (_func_void_PipelineStateCreateInfo_ptr_void_ptr *)0x0) &&
     (bVar3 = NamedResourceCache<Diligent::IPipelineState>::Get
                        (&(this->m_Cache).PSO,TilePipeline,UnpackInfo->Name,ppPSO), bVar3)) {
    return;
  }
  Archive = FindArchive(this,TilePipeline,UnpackInfo->Name);
  if (Archive == (ArchiveData *)0x0) {
    return;
  }
  Allocator = GetRawAllocator();
  PSOData<Diligent::TilePipelineStateCreateInfo>::PSOData
            ((PSOData<Diligent::TilePipelineStateCreateInfo> *)local_190,Allocator,0x800);
  bVar3 = DeviceObjectArchive::
          LoadResourceCommonData<Diligent::DearchiverBase::PSOData<Diligent::TilePipelineStateCreateInfo>>
                    ((Archive->pObjArchive)._M_t.
                     super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                     .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>.
                     _M_head_impl,TilePipeline,UnpackInfo->Name,
                     (PSOData<Diligent::TilePipelineStateCreateInfo> *)local_190);
  if (!bVar3) goto LAB_002599f8;
  iVar5 = (*(UnpackInfo->pDevice->super_IObject)._vptr_IObject[0x18])();
  if (*(int *)CONCAT44(extraout_var,iVar5) - 1U < 2) {
    local_e8 = local_e8 & 0xfd;
  }
  bVar3 = UnpackPSOSignatures<Diligent::TilePipelineStateCreateInfo>
                    (this,(PSOData<Diligent::TilePipelineStateCreateInfo> *)local_190,
                     UnpackInfo->pDevice);
  if ((!bVar3) ||
     (bVar3 = UnpackPSOShaders<Diligent::TilePipelineStateCreateInfo>
                        (this,Archive,(PSOData<Diligent::TilePipelineStateCreateInfo> *)local_190,
                         UnpackInfo->pDevice), !bVar3)) goto LAB_002599f8;
  PSOData<Diligent::TilePipelineStateCreateInfo>::AssignShaders
            ((PSOData<Diligent::TilePipelineStateCreateInfo> *)local_190);
  local_168.PSODesc.SRBAllocationGranularity = UnpackInfo->SRBAllocationGranularity;
  local_168.PSODesc.ImmediateContextMask = UnpackInfo->ImmediateContextMask;
  local_168.pPSOCache = UnpackInfo->pCache;
  if (UnpackInfo->ModifyPipelineStateCreateInfo !=
      (_func_void_PipelineStateCreateInfo_ptr_void_ptr *)0x0) {
    local_208 = (PipelineResourceSignatureDesc *)
                CONCAT71(local_208._1_7_,local_168.PSODesc.PipelineType);
    local_1b8.ImmutableSamplers = local_168.PSODesc.ResourceLayout.ImmutableSamplers;
    local_1b8.Variables = local_168.PSODesc.ResourceLayout.Variables;
    local_1b8.NumImmutableSamplers = local_168.PSODesc.ResourceLayout.NumImmutableSamplers;
    local_1b8._28_4_ = local_168.PSODesc.ResourceLayout._28_4_;
    local_1b8.DefaultVariableType = local_168.PSODesc.ResourceLayout.DefaultVariableType;
    local_1b8._1_3_ = local_168.PSODesc.ResourceLayout._1_3_;
    local_1b8.DefaultVariableMergeStages =
         local_168.PSODesc.ResourceLayout.DefaultVariableMergeStages;
    local_1b8.NumVariables = local_168.PSODesc.ResourceLayout.NumVariables;
    local_1b8._12_4_ = local_168.PSODesc.ResourceLayout._12_4_;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    std::
    vector<Diligent::ShaderResourceVariableDesc,std::allocator<Diligent::ShaderResourceVariableDesc>>
    ::vector<Diligent::ShaderResourceVariableDesc_const*,void>
              ((vector<Diligent::ShaderResourceVariableDesc,std::allocator<Diligent::ShaderResourceVariableDesc>>
                *)&local_1d0,local_168.PSODesc.ResourceLayout.Variables,
               local_168.PSODesc.ResourceLayout.Variables +
               (local_168.PSODesc.ResourceLayout._8_8_ & 0xffffffff),(allocator_type *)&local_228);
    if (local_1d0 != local_1c8) {
      pSVar8 = local_1d0;
      do {
        pVar11 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char_const*&>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&local_68,pSVar8);
        pSVar8->Name = *(Char **)((long)pVar11.first.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        ._M_cur.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 + 8);
        pSVar8 = pSVar8 + 1;
      } while (pSVar8 != local_1c8);
    }
    std::vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>::
    vector<Diligent::ImmutableSamplerDesc_const*,void>
              ((vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>
                *)&local_1e8,local_1b8.ImmutableSamplers,
               local_1b8.ImmutableSamplers + (local_1b8._24_8_ & 0xffffffff),
               (allocator_type *)&local_228);
    if (local_1e8 != local_1e0) {
      ppCVar9 = &local_1e8->SamplerOrTextureName;
      do {
        pVar11 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char_const*&>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&local_68,ppCVar9);
        *ppCVar9 = *(Char **)((long)pVar11.first.
                                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    ._M_cur.
                                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             + 8);
        pIVar10 = (ImmutableSamplerDesc *)(ppCVar9 + 8);
        ppCVar9 = ppCVar9 + 9;
      } while (pIVar10 != local_1e0);
    }
    local_1b8.Variables = local_1d0;
    local_1b8.ImmutableSamplers = local_1e8;
    std::
    vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
    ::vector<Diligent::IPipelineResourceSignature**,void>
              ((vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
                *)&local_200,local_168.ppResourceSignatures,
               local_168.ppResourceSignatures + local_168.ResourceSignaturesCount,
               (allocator_type *)&local_228);
    (*UnpackInfo->ModifyPipelineStateCreateInfo)(&local_168,UnpackInfo->pUserData);
    if ((PIPELINE_TYPE)local_208 == local_168.PSODesc.PipelineType) {
      bVar3 = PipelineResourceLayoutDesc::IsEqual
                        (&local_1b8,&local_168.PSODesc.ResourceLayout,false,true);
      if (!bVar3) {
        FormatString<char[84]>
                  (&local_228,
                   (char (*) [84])
                   "Only immutable sampler descriptions in the pipeline resource layout can be modified"
                  );
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,local_228._M_dataplus._M_p,0,0,0);
        }
        goto LAB_0025994c;
      }
      if ((local_1b8._24_8_ & 0xffffffff) != 0) {
        lVar7 = 0;
        do {
          if (*(int *)((long)((local_1b8.ImmutableSamplers)->Desc).BorderColor + lVar7 + -0x2c) !=
              *(int *)((long)((local_168.PSODesc.ResourceLayout.ImmutableSamplers)->Desc).
                             BorderColor + lVar7 + -0x2c)) {
            FormatString<char[80]>
                      (&local_228,
                       (char (*) [80])
                       "Modifying immutable sampler shader stages in the resource layout is not allowed"
                      );
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(2,local_228._M_dataplus._M_p,0,0,0);
            }
            goto LAB_0025994c;
          }
          lVar7 = lVar7 + 0x48;
        } while ((local_1b8._24_8_ & 0xffffffff) * 0x48 != lVar7);
      }
      if (local_1f8 - (long)local_200 >> 3 != (ulong)local_168.ResourceSignaturesCount) {
        FormatString<char[58]>
                  (&local_228,
                   (char (*) [58])"Changing the number of resource signatures is not allowed");
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,local_228._M_dataplus._M_p,0,0,0);
        }
        goto LAB_0025994c;
      }
      bVar3 = local_168.ResourceSignaturesCount == 0;
      if (!bVar3) {
        bVar3 = false;
        uVar6 = 0;
        do {
          pIVar1 = *(IPipelineResourceSignature **)((long)local_200 + uVar6 * 8);
          pIVar2 = local_168.ppResourceSignatures[uVar6];
          iVar5 = 0x13;
          if (pIVar1 != pIVar2) {
            if ((pIVar1 == (IPipelineResourceSignature *)0x0) ==
                (pIVar2 == (IPipelineResourceSignature *)0x0)) {
              if ((pIVar1 != (IPipelineResourceSignature *)0x0) &&
                 (pIVar2 != (IPipelineResourceSignature *)0x0)) {
                iVar5 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])();
                local_208 = (PipelineResourceSignatureDesc *)CONCAT44(extraout_var_00,iVar5);
                iVar5 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar2);
                bVar4 = PipelineResourceSignaturesCompatible
                                  (local_208,
                                   (PipelineResourceSignatureDesc *)CONCAT44(extraout_var_01,iVar5),
                                   true);
                iVar5 = 0;
                if (!bVar4) {
                  FormatString<char[134]>
                            (&local_228,
                             (char (*) [134])
                             "When changing pipeline resource signatures, only immutable sampler descriptions in new signatures are allowed to differ from original"
                            );
                  if (DebugMessageCallback != (undefined *)0x0) {
                    (*(code *)DebugMessageCallback)(2,local_228._M_dataplus._M_p,0,0,0);
                  }
                  goto LAB_002597c6;
                }
              }
            }
            else {
              FormatString<char[75]>
                        (&local_228,
                         (char (*) [75])
                         "Changing non-null resource signature to null and vice versa is not allowed"
                        );
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(2,local_228._M_dataplus._M_p,0,0);
              }
LAB_002597c6:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228._M_dataplus._M_p != &local_228.field_2) {
                operator_delete(local_228._M_dataplus._M_p,
                                local_228.field_2._M_allocated_capacity + 1);
              }
              iVar5 = 1;
            }
          }
          if ((iVar5 != 0x13) && (iVar5 != 0)) break;
          uVar6 = uVar6 + 1;
          bVar3 = uVar6 >= local_168.ResourceSignaturesCount;
        } while (uVar6 < local_168.ResourceSignaturesCount);
      }
    }
    else {
      FormatString<char[39]>(&local_228,(char (*) [39])"Modifying pipeline type is not allowed");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,local_228._M_dataplus._M_p,0,0,0);
      }
LAB_0025994c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      bVar3 = false;
    }
    if (local_200 != (void *)0x0) {
      operator_delete(local_200,local_1f0 - (long)local_200);
    }
    if (local_1e8 != (ImmutableSamplerDesc *)0x0) {
      operator_delete(local_1e8,local_1d8 - (long)local_1e8);
    }
    if (local_1d0 != (ShaderResourceVariableDesc *)0x0) {
      operator_delete(local_1d0,local_1c0 - (long)local_1d0);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    if (!bVar3) goto LAB_002599f8;
  }
  (*(UnpackInfo->pDevice->super_IObject)._vptr_IObject[0xc])(UnpackInfo->pDevice,&local_168,ppPSO);
  if (UnpackInfo->ModifyPipelineStateCreateInfo ==
      (_func_void_PipelineStateCreateInfo_ptr_void_ptr *)0x0) {
    NamedResourceCache<Diligent::IPipelineState>::Set
              (&(this->m_Cache).PSO,TilePipeline,UnpackInfo->Name,*ppPSO);
  }
LAB_002599f8:
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ::~vector(&local_80);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ::~vector(&local_98);
  DynamicLinearAllocator::~DynamicLinearAllocator((DynamicLinearAllocator *)local_190);
  return;
}

Assistant:

void DearchiverBase::UnpackPipelineStateImpl(const PipelineStateUnpackInfo& UnpackInfo,
                                             IPipelineState**               ppPSO)
{
    VERIFY_EXPR(UnpackInfo.pDevice != nullptr);

    constexpr auto ResType = PSOData<CreateInfoType>::ArchiveResType;

    // Do not cache modified PSOs
    if (UnpackInfo.ModifyPipelineStateCreateInfo == nullptr)
    {
        // Since PSO names must be unique (for each PSO type), we use a single cache for all
        // loaded archives.
        if (m_Cache.PSO.Get(ResType, UnpackInfo.Name, ppPSO))
            return;
    }

    // Find the archive that contains this PSO
    ArchiveData* pArchiveData = FindArchive(ResType, UnpackInfo.Name);
    if (pArchiveData == nullptr)
        return;

    PSOData<CreateInfoType> PSO{GetRawAllocator()};
    if (!pArchiveData->pObjArchive->LoadResourceCommonData(ResType, UnpackInfo.Name, PSO))
        return;

#ifdef DILIGENT_DEVELOPMENT
    if (UnpackInfo.pDevice->GetDeviceInfo().IsD3DDevice())
    {
        // We always have reflection information in Direct3D shaders, so always
        // load it in development build to allow the engine verify bindings.
        PSO.InternalCI.Flags &= ~PSO_CREATE_INTERNAL_FLAG_NO_SHADER_REFLECTION;
    }
#endif

    if (!UnpackPSORenderPass(PSO, UnpackInfo.pDevice))
        return;

    if (!UnpackPSOSignatures(PSO, UnpackInfo.pDevice))
        return;

    if (!UnpackPSOShaders(*pArchiveData, PSO, UnpackInfo.pDevice))
        return;

    PSO.AssignShaders();

    PSO.CreateInfo.PSODesc.SRBAllocationGranularity = UnpackInfo.SRBAllocationGranularity;
    PSO.CreateInfo.PSODesc.ImmediateContextMask     = UnpackInfo.ImmediateContextMask;
    PSO.CreateInfo.pPSOCache                        = UnpackInfo.pCache;

    if (!ModifyPipelineStateCreateInfo(PSO.CreateInfo, UnpackInfo))
        return;

    PSO.CreatePipeline(UnpackInfo.pDevice, ppPSO);

    if (UnpackInfo.ModifyPipelineStateCreateInfo == nullptr)
        m_Cache.PSO.Set(ResType, UnpackInfo.Name, *ppPSO);
}